

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int wstran_dialer_getopt(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int local_3c;
  int rv;
  ws_dialer *d;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  local_3c = nni_stream_dialer_get(*(nng_stream_dialer **)((long)arg + 0x210),name,buf,szp,t);
  if (local_3c == 9) {
    local_3c = nni_getopt(wstran_ep_opts,name,arg,buf,szp,t);
  }
  return local_3c;
}

Assistant:

static int
wstran_dialer_getopt(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	ws_dialer *d = arg;
	int        rv;

	rv = nni_stream_dialer_get(d->dialer, name, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_getopt(wstran_ep_opts, name, d, buf, szp, t);
	}
	return (rv);
}